

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O1

string * __thiscall
duckdb::BoxRenderer::FormatNumber(string *__return_storage_ptr__,BoxRenderer *this,string *input)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  char cVar5;
  idx_t c;
  ulong uVar6;
  ulong uVar7;
  string *__range1;
  bool bVar8;
  
  if ((this->config).large_number_rendering == ALL) {
    TryFormatLargeNumber(__return_storage_ptr__,this,input);
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &__return_storage_ptr__->field_2) {
      operator_delete(pcVar1);
    }
  }
  if ((this->config).thousand_separator == '\0' && (this->config).decimal_separator == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (input->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + input->_M_string_length);
  }
  else {
    if (input->_M_string_length == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      lVar2 = 0;
      do {
        bVar4 = (input->_M_dataplus)._M_p[lVar2] - 0x30;
        uVar6 = uVar6 + (bVar4 < 10);
        if (9 < bVar4) break;
        bVar8 = input->_M_string_length - 1 != lVar2;
        lVar2 = lVar2 + 1;
      } while (bVar8);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar5 = (char)__return_storage_ptr__;
    if (uVar6 != 0) {
      uVar3 = 3;
      if (uVar6 % 3 != 0) {
        uVar3 = uVar6 % 3;
      }
      uVar7 = 0;
      do {
        if ((uVar7 == uVar3) && ((this->config).thousand_separator != '\0')) {
          ::std::__cxx11::string::push_back(cVar5);
          uVar3 = uVar3 + 3;
        }
        ::std::__cxx11::string::push_back(cVar5);
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    if (uVar6 < input->_M_string_length) {
      do {
        ::std::__cxx11::string::push_back(cVar5);
        uVar6 = uVar6 + 1;
      } while (uVar6 < input->_M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::FormatNumber(const string &input) {
	if (config.large_number_rendering == LargeNumberRendering::ALL) {
		// when large number rendering is set to ALL, we try to format all numbers as large numbers
		auto number = TryFormatLargeNumber(input);
		if (!number.empty()) {
			return number;
		}
	}
	if (config.decimal_separator == '\0' && config.thousand_separator == '\0') {
		// no thousand separator
		return input;
	}
	// first check how many digits there are (preceding any decimal point)
	idx_t character_count = 0;
	for (auto c : input) {
		if (!StringUtil::CharacterIsDigit(c)) {
			break;
		}
		character_count++;
	}
	// find the position of the first thousand separator
	idx_t separator_position = character_count % 3 == 0 ? 3 : character_count % 3;
	// now add the thousand separators
	string result;
	for (idx_t c = 0; c < character_count; c++) {
		if (c == separator_position && config.thousand_separator != '\0') {
			result += config.thousand_separator;
			separator_position += 3;
		}
		result += input[c];
	}
	// add any remaining characters
	for (idx_t c = character_count; c < input.size(); c++) {
		if (input[c] == '.' && config.decimal_separator != '\0') {
			result += config.decimal_separator;
		} else {
			result += input[c];
		}
	}
	return result;
}